

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

void __thiscall
duckdb::PrimitiveDictionary<short,_int,_duckdb::ParquetCastOperator>::Insert
          (PrimitiveDictionary<short,_int,_duckdb::ParquetCastOperator> *this,short value)

{
  idx_t iVar1;
  bool bVar2;
  primitive_dictionary_entry_t *this_00;
  short in_SI;
  PrimitiveDictionary<short,_int,_duckdb::ParquetCastOperator> *in_RDI;
  primitive_dictionary_entry_t *entry;
  short *in_stack_ffffffffffffffe8;
  undefined6 in_stack_fffffffffffffff0;
  PrimitiveDictionary<short,_int,_duckdb::ParquetCastOperator> *this_01;
  
  if ((in_RDI->full & 1U) == 0) {
    this_01 = in_RDI;
    this_00 = Lookup((PrimitiveDictionary<short,_int,_duckdb::ParquetCastOperator> *)
                     CONCAT26(in_SI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    bVar2 = primitive_dictionary_entry_t::IsEmpty(this_00);
    if (bVar2) {
      if ((in_RDI->maximum_size < in_RDI->size + 1) ||
         (bVar2 = AddToTarget<short,_0>(this_01,(short *)CONCAT26(in_SI,in_stack_fffffffffffffff0)),
         !bVar2)) {
        in_RDI->full = true;
      }
      else {
        this_00->value = in_SI;
        iVar1 = in_RDI->size;
        in_RDI->size = iVar1 + 1;
        this_00->index = (uint32_t)iVar1;
      }
    }
  }
  return;
}

Assistant:

void Insert(SRC value) {
		if (full) {
			return;
		}
		auto &entry = Lookup(value);
		if (entry.IsEmpty()) {
			if (size + 1 > maximum_size || !AddToTarget(value)) {
				full = true;
				return;
			}
			entry.value = value;
			entry.index = size++;
		}
	}